

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

void archs_enable(void)

{
  if (archs_enable_initialized == '\0') {
    ARM_enable();
    AArch64_enable();
    Mips_enable();
    PPC_enable();
    Sparc_enable();
    SystemZ_enable();
    X86_enable();
    XCore_enable();
    archs_enable_initialized = '\x01';
  }
  return;
}

Assistant:

static void archs_enable(void)
{
	static bool initialized = false;

	if (initialized)
		return;

#ifdef CAPSTONE_HAS_ARM
	ARM_enable();
#endif
#ifdef CAPSTONE_HAS_ARM64
	AArch64_enable();
#endif
#ifdef CAPSTONE_HAS_MIPS
	Mips_enable();
#endif
#ifdef CAPSTONE_HAS_POWERPC
	PPC_enable();
#endif
#ifdef CAPSTONE_HAS_SPARC
	Sparc_enable();
#endif
#ifdef CAPSTONE_HAS_SYSZ
	SystemZ_enable();
#endif
#ifdef CAPSTONE_HAS_X86
	X86_enable();
#endif
#ifdef CAPSTONE_HAS_XCORE
	XCore_enable();
#endif


	initialized = true;
}